

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debuginfo.cpp
# Opt level: O1

string * __thiscall
DebugInfo::GetObjectFileDesc_abi_cxx11_(string *__return_storage_ptr__,DebugInfo *this,int index)

{
  pointer pOVar1;
  pointer pOVar2;
  pointer pcVar3;
  long lVar4;
  const_iterator cVar5;
  long *plVar6;
  long *plVar7;
  size_type *psVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_60 [2];
  long local_50 [2];
  long *local_40;
  long local_38;
  long local_30;
  long lStack_28;
  
  pOVar2 = (this->m_ObjectFiles).super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pOVar1 = pOVar2 + index;
  cVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::find(&(this->m_ObjectNameToFolders)._M_t,&pOVar2[index].fileName);
  if (((_Rb_tree_header *)cVar5._M_node ==
       &(this->m_ObjectNameToFolders)._M_t._M_impl.super__Rb_tree_header) ||
     (cVar5._M_node[3]._M_parent < (_Base_ptr)0x2)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = (pOVar1->fileName)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar3,pcVar3 + (pOVar1->fileName)._M_string_length)
    ;
  }
  else {
    pcVar3 = (pOVar1->fileName)._M_dataplus._M_p;
    local_60[0] = local_50;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_60,pcVar3,pcVar3 + (pOVar1->fileName)._M_string_length);
    std::__cxx11::string::append((char *)local_60);
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_60,(ulong)(pOVar1->fileDir)._M_dataplus._M_p);
    plVar7 = plVar6 + 2;
    if ((long *)*plVar6 == plVar7) {
      local_30 = *plVar7;
      lStack_28 = plVar6[3];
      local_40 = &local_30;
    }
    else {
      local_30 = *plVar7;
      local_40 = (long *)*plVar6;
    }
    local_38 = plVar6[1];
    *plVar6 = (long)plVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_40);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar8 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar8) {
      lVar4 = plVar6[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
    }
    __return_storage_ptr__->_M_string_length = plVar6[1];
    *plVar6 = (long)psVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if (local_40 != &local_30) {
      operator_delete(local_40,local_30 + 1);
    }
    if (local_60[0] != local_50) {
      operator_delete(local_60[0],local_50[0] + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DebugInfo::GetObjectFileDesc(int index) const
{
    const ObjectFileInfo& info = m_ObjectFiles[index];
    const auto it = m_ObjectNameToFolders.find(info.fileName);
    if (it == m_ObjectNameToFolders.end() || it->second.size() < 2)
        return info.fileName;
    return info.fileName + " (" + info.fileDir + ")";
}